

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_wrong_fragment_start(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  cio_error cVar2;
  char data [64];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ws_frame local_78;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  undefined2 local_20;
  
  local_78.data = &local_b8;
  local_50 = (undefined1 *)&local_b8;
  local_88 = 0x6161616161616161;
  uStack_80 = 0x6161616161616161;
  local_98 = 0x6161616161616161;
  uStack_90 = 0x6161616161616161;
  local_a8 = 0x6161616161616161;
  uStack_a0 = 0x6161616161616161;
  local_b8 = 0x6161616161616161;
  uStack_b0 = 0x6161616161616161;
  local_78.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
  local_78.direction = FROM_CLIENT;
  local_78.data_length = 0x40;
  local_78.last_frame = true;
  local_78.rsv = false;
  local_58 = 0;
  local_48 = 0x40;
  local_40 = 1;
  local_38 = 8;
  local_34 = 0;
  uStack_2c = 0;
  local_24 = 0;
  local_20 = 1;
  serialize_frames(&local_78,3);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar2 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Could not start reading a message!",0x73a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,
             "number of read_handler callbacks called not correct",0x73c,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_history[read_handler_fake.call_count - 1] == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
               "err parameter of read_handler not correct",0x73e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x740,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "websocket parameter of on_error not correct",0x741,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,"control callback was called for close frame",
               0x743,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("context parameter of read_handler not correct",0x73d);
}

Assistant:

static void test_wrong_fragment_start(void)
{
	char data[64];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "number of read_handler callbacks called not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_handler_fake.call_count - 1], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, on_error_fake.arg0_val, "websocket parameter of on_error not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called for close frame");
}